

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getModel(void *highs,HighsInt a_format,HighsInt q_format,HighsInt *num_col,
                       HighsInt *num_row,HighsInt *num_nz,HighsInt *q_num_nz,HighsInt *sense,
                       double *offset,double *col_cost,double *col_lower,double *col_upper,
                       double *row_lower,double *row_upper,HighsInt *a_start,HighsInt *a_index,
                       double *a_value,HighsInt *q_start,HighsInt *q_index,double *q_value,
                       HighsInt *integrality)

{
  HighsModel *pHVar1;
  const_reference pvVar2;
  int *piVar3;
  double *__src;
  int *in_RCX;
  Highs *in_RDI;
  HighsInt *in_stack_00000008;
  HighsInt *in_stack_00000010;
  HighsInt *in_stack_00000018;
  HighsInt *in_stack_00000020;
  HighsInt in_stack_0000002c;
  HighsLp *in_stack_00000030;
  double *in_stack_00000040;
  double *in_stack_00000048;
  double *in_stack_00000050;
  double *in_stack_00000058;
  double *in_stack_00000060;
  double *in_stack_00000068;
  HighsInt *in_stack_00000070;
  HighsHessian *hessian;
  double *in_stack_00000080;
  HighsInt return_status;
  HighsInt local_34;
  
  Highs::getLp(in_RDI);
  local_34 = Highs_getHighsLpData
                       (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_00000018,
                        in_stack_00000010,in_stack_00000008,in_stack_00000040,in_stack_00000048,
                        in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
                        in_stack_00000070,&hessian->dim_,in_stack_00000080,num_nz);
  if (local_34 == 0) {
    pHVar1 = Highs::getModel(in_RDI);
    if (0 < (pHVar1->hessian_).dim_) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(pHVar1->hessian_).start_,(long)*in_RCX);
      *in_stack_00000008 = *pvVar2;
      if (in_stack_00000060 != (double *)0x0) {
        piVar3 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x43affd);
        memcpy(in_stack_00000060,piVar3,(long)*in_RCX << 2);
      }
      if (in_stack_00000068 != (double *)0x0) {
        piVar3 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x43b03f);
        memcpy(in_stack_00000068,piVar3,(long)*in_stack_00000008 << 2);
      }
      if (in_stack_00000070 != (HighsInt *)0x0) {
        __src = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x43b081);
        memcpy(in_stack_00000070,__src,(long)*in_stack_00000008 << 3);
      }
    }
    local_34 = 0;
  }
  return local_34;
}

Assistant:

HighsInt Highs_getModel(const void* highs, const HighsInt a_format,
                        const HighsInt q_format, HighsInt* num_col,
                        HighsInt* num_row, HighsInt* num_nz, HighsInt* q_num_nz,
                        HighsInt* sense, double* offset, double* col_cost,
                        double* col_lower, double* col_upper, double* row_lower,
                        double* row_upper, HighsInt* a_start, HighsInt* a_index,
                        double* a_value, HighsInt* q_start, HighsInt* q_index,
                        double* q_value, HighsInt* integrality) {
  HighsInt return_status = Highs_getHighsLpData(
      ((Highs*)highs)->getLp(), a_format, num_col, num_row, num_nz, sense,
      offset, col_cost, col_lower, col_upper, row_lower, row_upper, a_start,
      a_index, a_value, integrality);
  if (return_status != kHighsStatusOk) return return_status;
  const HighsHessian& hessian = ((Highs*)highs)->getModel().hessian_;
  if (hessian.dim_ > 0) {
    *q_num_nz = hessian.start_[*num_col];
    if (q_start)
      memcpy(q_start, hessian.start_.data(), *num_col * sizeof(HighsInt));
    if (q_index)
      memcpy(q_index, hessian.index_.data(), *q_num_nz * sizeof(HighsInt));
    if (q_value)
      memcpy(q_value, hessian.value_.data(), *q_num_nz * sizeof(double));
  }
  return kHighsStatusOk;
}